

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HDualRow.cpp
# Opt level: O1

void __thiscall HDualRow::rp_hsol_pv_r(HDualRow *this)

{
  uint uVar1;
  int iVar2;
  pointer piVar3;
  pointer pdVar4;
  size_type __n;
  uint uVar5;
  long lVar6;
  size_type sVar7;
  vector<double,_std::allocator<double>_> dse_pv_r;
  vector<double,_std::allocator<double>_> local_48;
  value_type_conflict1 local_28;
  
  uVar1 = this->workModel->numTot;
  __n = (size_type)(int)uVar1;
  if ((long)__n < 0x15) {
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_start = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    local_28 = 0.0;
    std::vector<double,_std::allocator<double>_>::_M_fill_assign(&local_48,__n,&local_28);
    iVar2 = this->packCount;
    if (0 < (long)iVar2) {
      piVar3 = (this->packIndex).super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      pdVar4 = (this->packValue).super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_start;
      lVar6 = 0;
      do {
        local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start[piVar3[lVar6]] = pdVar4[lVar6];
        lVar6 = lVar6 + 1;
      } while (iVar2 != lVar6);
    }
    printf("PvR: Ix  ");
    if (0 < (int)uVar1) {
      uVar5 = 0;
      do {
        printf(" %4d",(ulong)uVar5);
        uVar5 = uVar5 + 1;
      } while (uVar1 != uVar5);
    }
    putchar(10);
    printf("      V  ");
    if (0 < (int)uVar1) {
      sVar7 = 0;
      do {
        printf(" %4.1g",SUB84(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start[sVar7],0));
        sVar7 = sVar7 + 1;
      } while (__n != sVar7);
    }
    putchar(10);
    if (local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data
        ._M_start != (pointer)0x0) {
      operator_delete(local_48.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  return;
}

Assistant:

void HDualRow::rp_hsol_pv_r() {
 	//Set limits on problem size for reporting
	const int mx_rp_numTot = 20;
	int numTot = workModel->getNumTot();
	if (numTot>mx_rp_numTot) return;
	vector<double> dse_pv_r;
	dse_pv_r.assign(numTot, 0);
	for (int i = 0; i < packCount; i++) {
		int c_n = packIndex[i];
		dse_pv_r[c_n] = packValue[i];
	}
	printf("PvR: Ix  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4d", i);
	}
	printf("\n");
	printf("      V  ");
	for (int i = 0; i < numTot; i++) {
		printf(" %4.1g", dse_pv_r[i]);
	}
	printf("\n");

}